

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_helper.cc
# Opt level: O3

int bio_socket_should_retry(int return_value)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = 0;
  if (return_value == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    iVar2 = 1;
    if ((((0x2c < iVar1 - 0x47U) || ((0x101000000001U >> ((ulong)(iVar1 - 0x47U) & 0x3f) & 1) == 0))
        && (iVar1 != 4)) && (iVar1 != 0xb)) {
      return (int)(iVar1 == 0x72);
    }
  }
  return iVar2;
}

Assistant:

int bio_socket_should_retry(int return_value) {
#if defined(OPENSSL_WINDOWS)
  return return_value == -1 && WSAGetLastError() == WSAEWOULDBLOCK;
#else
  // On POSIX platforms, sockets and fds are the same.
  return bio_errno_should_retry(return_value);
#endif
}